

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O2

void __thiscall PcodeSnippet::~PcodeSnippet(PcodeSnippet *this)

{
  ConstructTpl *this_00;
  _Base_ptr p_Var1;
  
  (this->super_PcodeCompile)._vptr_PcodeCompile = (_func_int **)&PTR_allocateTemp_00401770;
  for (p_Var1 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->tree)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  this_00 = this->result;
  if (this_00 != (ConstructTpl *)0x0) {
    ConstructTpl::~ConstructTpl(this_00);
    operator_delete(this_00);
    this->result = (ConstructTpl *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->firsterror);
  std::
  _Rb_tree<SleighSymbol_*,_SleighSymbol_*,_std::_Identity<SleighSymbol_*>,_SymbolCompare,_std::allocator<SleighSymbol_*>_>
  ::~_Rb_tree(&(this->tree)._M_t);
  std::__cxx11::string::~string((string *)&(this->lexer).curidentifier);
  return;
}

Assistant:

PcodeSnippet::~PcodeSnippet(void)

{
  SymbolTree::iterator iter;
  for(iter=tree.begin();iter!=tree.end();++iter)
    delete *iter;		// Free ALL temporary symbols
  if (result != (ConstructTpl *)0) {
    delete result;
    result = (ConstructTpl *)0;
  }
}